

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O1

NODE * insert(NODE **p,KEY key)

{
  int iVar1;
  node *pnVar2;
  NODE *pNVar3;
  
  pnVar2 = *p;
  if (*p != (NODE *)0x0) {
    do {
      pNVar3 = pnVar2;
      iVar1 = pNVar3->data;
      if (iVar1 == key) {
        return (NODE *)0x0;
      }
      pnVar2 = (&pNVar3->left)[iVar1 <= key];
    } while ((&pNVar3->left)[iVar1 <= key] != (node *)0x0);
    p = &pNVar3->left + (iVar1 <= key);
  }
  pNVar3 = (NODE *)malloc(0x18);
  if (pNVar3 == (NODE *)0x0) {
    puts("Out of memory");
    exit(1);
  }
  pNVar3->data = key;
  pNVar3->left = (node *)0x0;
  pNVar3->right = (node *)0x0;
  *p = pNVar3;
  return pNVar3;
}

Assistant:

NODE *insert(NODE **p, KEY key) {
  NODE *new;
  while (*p != NULL) {
    if (keyequal(key, (*p)->data)) {
      return NULL;
    } else if (keylt(key, (*p)->data)) {
      p = &(*p)->left;
    } else {
      p = &(*p)->right;
    }
  }

  if ((new = (NODE *)malloc(sizeof(NODE))) == NULL) {
    printf("Out of memory\n");
    exit(1);
  }

  new->data = key;
  new->left = NULL;
  new->right = NULL;

  *p = new;
  return new;
}